

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

JSON * chaiscript::json::JSONParser::parse_number
                 (JSON *__return_storage_ptr__,string *str,size_t *offset)

{
  char cVar1;
  char __rhs;
  ulong uVar2;
  bool bVar3;
  size_type sVar4;
  __index_type _Var5;
  int iVar6;
  const_reference pvVar7;
  byte *pbVar8;
  type_conflict5 tVar9;
  runtime_error *prVar10;
  long lVar11;
  bool bVar12;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  byte __c;
  byte __rhs_00;
  JSON *pJVar14;
  type_conflict2 tVar15;
  double dVar16;
  string_view t_str;
  string_view t_str_00;
  string_view t_str_01;
  allocator<char> local_e9;
  double local_e8;
  double local_e0;
  JSON *local_d8;
  string val;
  string exp_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  char *pcVar13;
  
  val._M_dataplus._M_p = (pointer)&val.field_2;
  val._M_string_length = 0;
  val.field_2._M_local_buf[0] = '\0';
  exp_str._M_dataplus._M_p = (pointer)&exp_str.field_2;
  exp_str._M_string_length = 0;
  exp_str.field_2._M_local_buf[0] = '\0';
  local_e8 = (double)CONCAT44(local_e8._4_4_,1);
  local_d8 = __return_storage_ptr__;
  if ((*offset < str->_M_string_length) &&
     (pvVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                         (str,*offset), *pvVar7 == '-')) {
    *offset = *offset + 1;
    local_e8 = (double)CONCAT44(local_e8._4_4_,0xffffffff);
  }
  bVar3 = false;
  __c = 0;
  while (uVar2 = *offset, __rhs_00 = __c, uVar2 < str->_M_string_length) {
    *offset = uVar2 + 1;
    pbVar8 = (byte *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::at(str,uVar2);
    __c = *pbVar8;
    if ((byte)(__c - 0x30) < 10) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&val,__c);
    }
    else {
      __rhs_00 = __c;
      if (__c == 0x2e) {
        __rhs_00 = 0x2e;
      }
      if ((bool)(__c != 0x2e | bVar3)) break;
      bVar3 = true;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&val,'.');
    }
  }
  uVar2 = *offset;
  bVar12 = (__rhs_00 & 0xdf) != 0x45 || str->_M_string_length <= uVar2;
  pcVar13 = (char *)(ulong)bVar12;
  if (bVar12) {
    local_e0 = 0.0;
    if ((((uVar2 < str->_M_string_length) &&
         (iVar6 = isspace((int)(char)__rhs_00), pcVar13 = extraout_RDX_01, (char)iVar6 == '\0')) &&
        (__rhs_00 != 0x2c)) && ((__rhs_00 != 0x5d && (__rhs_00 != 0x7d)))) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"JSON ERROR: Number: unexpected character \'",&local_e9);
      std::operator+(&local_70,&local_90,__rhs_00);
      std::operator+(&local_50,&local_70,"\'");
      std::runtime_error::runtime_error(prVar10,(string *)&local_50);
      __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    *offset = uVar2 + 1;
    pvVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                       (str,uVar2);
    cVar1 = *pvVar7;
    if ((cVar1 != '+') && (cVar1 != '-')) {
      *offset = *offset - 1;
    }
    pcVar13 = extraout_RDX;
    while (uVar2 = *offset, uVar2 < str->_M_string_length) {
      *offset = uVar2 + 1;
      pvVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                         (str,uVar2);
      __rhs = *pvVar7;
      if (9 < (byte)(__rhs - 0x30U)) {
        iVar6 = isspace((int)__rhs);
        pcVar13 = extraout_RDX_02;
        if (((((char)iVar6 == '\0') && (__rhs != ',')) && (__rhs != ']')) && (__rhs != '}')) {
          prVar10 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_90,
                     "JSON ERROR: Number: Expected a number for exponent, found \'",&local_e9);
          std::operator+(&local_70,&local_90,__rhs);
          std::operator+(&local_50,&local_70,"\'");
          std::runtime_error::runtime_error(prVar10,(string *)&local_50);
          __cxa_throw(prVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        break;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&exp_str,__rhs);
      pcVar13 = extraout_RDX_00;
    }
    t_str._M_str = pcVar13;
    t_str._M_len = (size_t)exp_str._M_dataplus._M_p;
    tVar9 = parse_num<long>((chaiscript *)exp_str._M_string_length,t_str);
    lVar11 = -tVar9;
    if (cVar1 != '-') {
      lVar11 = tVar9;
    }
    local_e0 = (double)lVar11;
    pcVar13 = extraout_RDX_03;
  }
  sVar4 = exp_str._M_string_length;
  *offset = *offset - 1;
  if (bVar3) {
    local_e8 = (double)local_e8._0_4_;
    t_str_00._M_str = pcVar13;
    t_str_00._M_len = (size_t)val._M_dataplus._M_p;
    tVar15 = parse_num<double>((chaiscript *)val._M_string_length,t_str_00);
    local_e8 = tVar15 * local_e8;
    dVar16 = pow(10.0,local_e0);
    dVar16 = dVar16 * local_e8;
    pJVar14 = local_d8;
  }
  else {
    t_str_01._M_str = pcVar13;
    t_str_01._M_len = (size_t)val._M_dataplus._M_p;
    tVar9 = parse_num<long>((chaiscript *)val._M_string_length,t_str_01);
    pJVar14 = local_d8;
    if (sVar4 == 0) {
      *(type_conflict5 *)
       &(local_d8->internal).d.
        super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
        .
        super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
        .
        super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
        .
        super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
        .
        super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           = tVar9 * local_e8._0_4_;
      _Var5 = '\x05';
      goto LAB_0034bdcd;
    }
    local_e8 = (double)tVar9 * (double)local_e8._0_4_;
    dVar16 = pow(10.0,local_e0);
    dVar16 = dVar16 * local_e8;
  }
  *(double *)
   &(pJVar14->internal).d.
    super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
    .
    super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
    .
    super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
    .
    super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
    .
    super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
       = dVar16;
  _Var5 = '\x04';
LAB_0034bdcd:
  *(__index_type *)
   ((long)&(pJVar14->internal).d.
           super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
           .
           super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
   + 0x20) = _Var5;
  std::__cxx11::string::~string((string *)&exp_str);
  std::__cxx11::string::~string((string *)&val);
  return pJVar14;
}

Assistant:

static JSON parse_number(const std::string &str, size_t &offset) {
      std::string val, exp_str;
      char c = '\0';
      bool isDouble = false;
      bool isNegative = false;
      std::int64_t exp = 0;
      bool isExpNegative = false;
      if (offset < str.size() && str.at(offset) == '-') {
        isNegative = true;
        ++offset;
      }
      for (; offset < str.size();) {
        c = str.at(offset++);
        if (c >= '0' && c <= '9') {
          val += c;
        } else if (c == '.' && !isDouble) {
          val += c;
          isDouble = true;
        } else {
          break;
        }
      }
      if (offset < str.size() && (c == 'E' || c == 'e')) {
        c = str.at(offset++);
        if (c == '-') {
          isExpNegative = true;
        } else if (c == '+') {
          // do nothing
        } else {
          --offset;
        }

        for (; offset < str.size();) {
          c = str.at(offset++);
          if (c >= '0' && c <= '9') {
            exp_str += c;
          } else if (!isspace(c) && c != ',' && c != ']' && c != '}') {
            throw std::runtime_error(std::string("JSON ERROR: Number: Expected a number for exponent, found '") + c + "'");
          } else {
            break;
          }
        }
        exp = chaiscript::parse_num<std::int64_t>(exp_str) * (isExpNegative ? -1 : 1);
      } else if (offset < str.size() && (!isspace(c) && c != ',' && c != ']' && c != '}')) {
        throw std::runtime_error(std::string("JSON ERROR: Number: unexpected character '") + c + "'");
      }
      --offset;

      if (isDouble) {
        return JSON((isNegative ? -1 : 1) * chaiscript::parse_num<double>(val) * std::pow(10, exp));
      } else {
        if (!exp_str.empty()) {
          return JSON((isNegative ? -1 : 1) * static_cast<double>(chaiscript::parse_num<std::int64_t>(val)) * std::pow(10, exp));
        } else {
          return JSON((isNegative ? -1 : 1) * chaiscript::parse_num<std::int64_t>(val));
        }
      }
    }